

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

bool __thiscall BaseIndex::Commit(BaseIndex *this)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  __pointer_type pCVar4;
  CDBBatch *in_RDI;
  long in_FS_OFFSET;
  byte fSync;
  bool bVar5;
  Level in_stack_00000060;
  char (*in_stack_00000070) [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000078;
  bool ok;
  CDBBatch batch;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  CDBBatch *in_stack_fffffffffffffec0;
  CBlockIndex *in_stack_fffffffffffffec8;
  CDBWrapper *in_stack_fffffffffffffed0;
  CDBBatch *in_stack_fffffffffffffed8;
  undefined7 in_stack_ffffffffffffff08;
  LogFlags in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  CDBBatch *batch_00;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  ConstevalFormatString<2U> in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  batch_00 = in_RDI;
  pCVar4 = std::atomic::operator_cast_to_CBlockIndex_
                     ((atomic<const_CBlockIndex_*> *)
                      CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  fSync = pCVar4 != (__pointer_type)0x0;
  if ((bool)fSync) {
    (*(code *)in_RDI->parent[1].m_name._M_dataplus._M_p)();
    CDBBatch::CDBBatch(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    uVar3 = (**(code **)&in_RDI->parent->m_is_memory)(in_RDI,&stack0xffffffffffffff80);
    bVar2 = (byte)uVar3;
    fSync = bVar2 & 1;
    if ((uVar3 & 1) != 0) {
      (*(code *)in_RDI->parent[1].m_name._M_dataplus._M_p)();
      std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator*
                ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                 in_stack_fffffffffffffec8);
      std::atomic<const_CBlockIndex_*>::load
                ((atomic<const_CBlockIndex_*> *)in_stack_fffffffffffffed0,
                 (memory_order)((ulong)in_stack_fffffffffffffec8 >> 0x20));
      CBlockIndex::GetBlockHash(in_stack_fffffffffffffec8);
      GetLocator((Chain *)in_RDI,(uint256 *)CONCAT17(bVar2,in_stack_ffffffffffffff08));
      DB::WriteBestBlock((DB *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                         (CBlockLocator *)
                         CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      CBlockLocator::~CBlockLocator
                ((CBlockLocator *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      (*(code *)in_RDI->parent[1].m_name._M_dataplus._M_p)();
      fSync = CDBWrapper::WriteBatch
                        ((CDBWrapper *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40)
                         ,batch_00,(bool)fSync);
    }
    CDBBatch::~CDBBatch((CDBBatch *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  bVar5 = (fSync & 1) != 0;
  if (!bVar5) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
               (char *)in_stack_fffffffffffffed0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffed8,
               (char *)in_stack_fffffffffffffed0);
    GetName_abi_cxx11_((BaseIndex *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    LogPrintFormatInternal<char[7],std::__cxx11::string>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff20,in_stack_00000060,in_stack_ffffffffffffff68,
               in_stack_00000070,in_stack_00000078);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool BaseIndex::Commit()
{
    // Don't commit anything if we haven't indexed any block yet
    // (this could happen if init is interrupted).
    bool ok = m_best_block_index != nullptr;
    if (ok) {
        CDBBatch batch(GetDB());
        ok = CustomCommit(batch);
        if (ok) {
            GetDB().WriteBestBlock(batch, GetLocator(*m_chain, m_best_block_index.load()->GetBlockHash()));
            ok = GetDB().WriteBatch(batch);
        }
    }
    if (!ok) {
        LogError("%s: Failed to commit latest %s state\n", __func__, GetName());
        return false;
    }
    return true;
}